

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readArray(OurReader *this,Token *tokenStart)

{
  iterator *piVar1;
  ushort uVar2;
  Value *pVVar3;
  bool bVar4;
  char *pcVar5;
  _Elt_pointer ppVVar6;
  byte *pbVar7;
  ushort uVar8;
  int iVar9;
  int index;
  Token endArray;
  Value init;
  Token token;
  undefined1 local_90 [32];
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  Token local_48;
  
  uVar8 = local_68 & 0xfe00;
  local_68 = uVar8 | 6;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  pcVar5 = (char *)operator_new(0x30);
  pcVar5[0x10] = '\0';
  pcVar5[0x11] = '\0';
  pcVar5[0x12] = '\0';
  pcVar5[0x13] = '\0';
  pcVar5[0x14] = '\0';
  pcVar5[0x15] = '\0';
  pcVar5[0x16] = '\0';
  pcVar5[0x17] = '\0';
  pcVar5[0x18] = '\0';
  pcVar5[0x19] = '\0';
  pcVar5[0x1a] = '\0';
  pcVar5[0x1b] = '\0';
  pcVar5[0x1c] = '\0';
  pcVar5[0x1d] = '\0';
  pcVar5[0x1e] = '\0';
  pcVar5[0x1f] = '\0';
  pcVar5[0x20] = '\0';
  pcVar5[0x21] = '\0';
  pcVar5[0x22] = '\0';
  pcVar5[0x23] = '\0';
  pcVar5[0x24] = '\0';
  pcVar5[0x25] = '\0';
  pcVar5[0x26] = '\0';
  pcVar5[0x27] = '\0';
  pcVar5[0x28] = '\0';
  pcVar5[0x29] = '\0';
  pcVar5[0x2a] = '\0';
  pcVar5[0x2b] = '\0';
  pcVar5[0x2c] = '\0';
  pcVar5[0x2d] = '\0';
  pcVar5[0x2e] = '\0';
  pcVar5[0x2f] = '\0';
  pcVar5[0] = '\0';
  pcVar5[1] = '\0';
  pcVar5[2] = '\0';
  pcVar5[3] = '\0';
  pcVar5[4] = '\0';
  pcVar5[5] = '\0';
  pcVar5[6] = '\0';
  pcVar5[7] = '\0';
  pcVar5[8] = '\0';
  pcVar5[9] = '\0';
  pcVar5[10] = '\0';
  pcVar5[0xb] = '\0';
  pcVar5[0xc] = '\0';
  pcVar5[0xd] = '\0';
  pcVar5[0xe] = '\0';
  pcVar5[0xf] = '\0';
  *(char **)(pcVar5 + 0x18) = pcVar5 + 8;
  *(char **)(pcVar5 + 0x20) = pcVar5 + 8;
  pcVar5[0x28] = '\0';
  pcVar5[0x29] = '\0';
  pcVar5[0x2a] = '\0';
  pcVar5[0x2b] = '\0';
  pcVar5[0x2c] = '\0';
  pcVar5[0x2d] = '\0';
  pcVar5[0x2e] = '\0';
  pcVar5[0x2f] = '\0';
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar3 = ppVVar6[-1];
  uVar2 = *(ushort *)&pVVar3->field_0x8;
  *(ushort *)&pVVar3->field_0x8 = uVar2 & 0xff00 | 6;
  local_70.map_ = *(ObjectValues **)&pVVar3->value_;
  (pVVar3->value_).string_ = pcVar5;
  *(ushort *)&pVVar3->field_0x8 = uVar2 & 0xfe00 | 6;
  local_68 = uVar2 & 0x100 | uVar8 | uVar2 & 0xff;
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar6[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  pbVar7 = (byte *)this->current_;
  while (((pbVar7 != (byte *)this->end_ && ((ulong)*pbVar7 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
    this->current_ = (Location)pbVar7;
  }
  if (*this->current_ == ']') {
    readToken(this,(Token *)local_90);
  }
  else {
    index = 0;
    do {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar6 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_90._0_8_ = Value::operator[](ppVVar6[-1],index);
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar6 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                  ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_90);
      }
      else {
        *ppVVar6 = (Value *)local_90._0_8_;
        piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar4 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (bVar4) {
        readToken(this,&local_48);
        while (local_48.type_ == tokenComment) {
          readToken(this,&local_48);
        }
        if (local_48.type_ == tokenArrayEnd) {
          iVar9 = 2;
        }
        else if (local_48.type_ == tokenArraySeparator) {
          iVar9 = 0;
        }
        else {
          local_90._0_8_ = local_90 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"Missing \',\' or \']\' in array declaration","");
          addError(this,(string *)local_90,&local_48,(Location)0x0);
          recoverFromError(this,tokenArrayEnd);
          if ((Value *)local_90._0_8_ != (Value *)(local_90 + 0x10)) {
            operator_delete((void *)local_90._0_8_);
          }
          iVar9 = 1;
        }
      }
      else {
        iVar9 = 1;
        recoverFromError(this,tokenArrayEnd);
      }
      index = index + 1;
    } while (iVar9 == 0);
    if (iVar9 != 2) {
      bVar4 = false;
      goto LAB_0010f7ce;
    }
  }
  bVar4 = true;
LAB_0010f7ce:
  Value::~Value((Value *)&local_70);
  return bVar4;
}

Assistant:

bool OurReader::readArray(Token& tokenStart) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}